

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.h
# Opt level: O0

void __thiscall Server<Client>::start(Server<Client> *this)

{
  bool bVar1;
  packaged_task<void_()> *in_RDI;
  AcceptException *ex;
  packaged_task<void_()> task;
  Client cl;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  ThreadPool<std::packaged_task<void_()>_> *in_stack_ffffffffffffffa0;
  atomic<bool> *in_stack_ffffffffffffffa8;
  anon_class_16_2_37edc3c6_for__M_fn *in_stack_ffffffffffffffc8;
  packaged_task<void_()> *in_stack_ffffffffffffffd0;
  Client local_c [3];
  
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    (**((in_RDI[1]._M_state.
         super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->super__State_base)._vptr__State_baseV2)(local_c);
    Client::Client((Client *)&stack0xffffffffffffffc8,local_c);
    std::packaged_task<void()>::packaged_task<Server<Client>::start()::_lambda()_1_,void>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    start()::{lambda()#1}::~start((anon_class_16_2_37edc3c6_for__M_fn *)0x10645e);
    ThreadPool<std::packaged_task<void_()>_>::push
              (in_stack_ffffffffffffffa0,
               (packaged_task<void_()> *)
               CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    std::packaged_task<void_()>::~packaged_task(in_RDI);
    Client::~Client((Client *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void Server<T>::start() {
    is_working = true;
    while(is_working) {
        try {
            T cl(acceptor.accept());
            std::packaged_task<void(void)> task(
                [this, client = std::move(cl)] () mutable {
                    handler.handle(std::move(client));
                }
            );
            thread_pool.push(std::move(task));
        } catch (AcceptException& ex) {
            stream << ex.what() << std::endl;
        }
    }
}